

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void __thiscall djb::tab_r::normalize_ndf(tab_r *this)

{
  float fVar1;
  size_type sVar2;
  reference pvVar3;
  reference a;
  float_t fVar4;
  int local_2c;
  int local_28;
  int i_1;
  int i;
  float local_1c;
  float_t nrm;
  tab_r *local_10;
  tab_r *this_local;
  
  local_10 = this;
  vec2::vec2((vec2 *)&stack0xffffffffffffffe8,1.0,1.0);
  fVar4 = cdf(this,(vec2 *)&stack0xffffffffffffffe8,1.0);
  if (fVar4 <= 0.0) {
    __assert_fail("cdf(vec2(1, 1), 1) > 0 && \"Invalid NDF normalization\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/plot-brdf/dj_brdf.h"
                  ,0x840,"void djb::tab_r::normalize_ndf()");
  }
  vec2::vec2((vec2 *)&i_1,1.0,1.0);
  fVar4 = cdf(this,(vec2 *)&i_1,1.0);
  local_1c = 1.0 / fVar4;
  for (local_28 = 0; sVar2 = std::vector<float,_std::allocator<float>_>::size(&this->m_ndf),
      fVar1 = local_1c, local_28 < (int)sVar2; local_28 = local_28 + 1) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_ndf,(long)local_28);
    *pvVar3 = fVar1 * *pvVar3;
  }
  for (local_2c = 0; sVar2 = std::vector<djb::vec2,_std::allocator<djb::vec2>_>::size(&this->m_cdf),
      fVar1 = local_1c, local_2c < (int)sVar2; local_2c = local_2c + 1) {
    a = std::vector<djb::vec2,_std::allocator<djb::vec2>_>::operator[](&this->m_cdf,(long)local_2c);
    operator*=(a,fVar1);
  }
  fprintf(_stdout,"djb_verbose: NDF norm. constant = %.9f\n",(double)local_1c);
  return;
}

Assistant:

void tab_r::normalize_ndf()
{
	DJB_ASSERT(cdf(vec2(1, 1), 1) > 0 && "Invalid NDF normalization");
	float_t nrm = 1 / cdf(vec2(1, 1), 1);

	for (int i = 0; i < (int)m_ndf.size(); ++i)
		m_ndf[i]*= nrm;

	for (int i = 0; i < (int)m_cdf.size(); ++i)
		m_cdf[i]*= nrm;

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: NDF norm. constant = %.9f\n", (double)nrm);
#endif
}